

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

int * i4vec_uniform_ab_new(int n,int a,int b,int *seed)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  float fVar9;
  
  iVar1 = *seed;
  if (iVar1 != 0) {
    iVar7 = a;
    if (a < b) {
      iVar7 = b;
    }
    if (b < a) {
      a = b;
    }
    uVar8 = 0;
    uVar6 = 0xffffffffffffffff;
    if (-1 < n) {
      uVar6 = (ulong)(uint)n << 2;
    }
    uVar5 = (ulong)(uint)n;
    if (n < 1) {
      uVar5 = uVar8;
    }
    piVar2 = (int *)operator_new__(uVar6);
    for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      iVar3 = (iVar1 % 0x1f31d) * 0x41a7;
      iVar1 = (iVar1 / 0x1f31d) * -0xb14;
      iVar4 = iVar3 + iVar1;
      iVar1 = iVar3 + iVar1 + 0x7fffffff;
      if (-1 < iVar4) {
        iVar1 = iVar4;
      }
      *seed = iVar1;
      fVar9 = roundf((float)iVar1 * 4.656613e-10 * ((float)iVar7 + 0.5) +
                     (1.0 - (float)iVar1 * 4.656613e-10) * ((float)a + -0.5));
      iVar3 = (int)fVar9;
      if ((int)fVar9 < a) {
        iVar3 = a;
      }
      if (iVar7 < iVar3) {
        iVar3 = iVar7;
      }
      piVar2[uVar8] = iVar3;
    }
    return piVar2;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"I4VEC_UNIFORM_AB_NEW - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  Input value of SEED = 0.\n");
  exit(1);
}

Assistant:

int *i4vec_uniform_ab_new ( int n, int a, int b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    I4VEC_UNIFORM_AB_NEW returns a scaled pseudorandom I4VEC.
//
//  Discussion:
//
//    An I4VEC is a vector of I4's.
//
//    The pseudorandom numbers should be uniformly distributed
//    between A and B.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    24 May 2012
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Paul Bratley, Bennett Fox, Linus Schrage,
//    A Guide to Simulation,
//    Second Edition,
//    Springer, 1987,
//    ISBN: 0387964673,
//    LC: QA76.9.C65.B73.
//
//    Bennett Fox,
//    Algorithm 647:
//    Implementation and Relative Efficiency of Quasirandom
//    Sequence Generators,
//    ACM Transactions on Mathematical Software,
//    Volume 12, Number 4, December 1986, pages 362-376.
//
//    Pierre L'Ecuyer,
//    Random Number Generation,
//    in Handbook of Simulation,
//    edited by Jerry Banks,
//    Wiley, 1998,
//    ISBN: 0471134031,
//    LC: T57.62.H37.
//
//    Peter Lewis, Allen Goodman, James Miller,
//    A Pseudo-Random Number Generator for the System/360,
//    IBM Systems Journal,
//    Volume 8, Number 2, 1969, pages 136-143.
//
//  Parameters:
//
//    Input, int N, the dimension of the vector.
//
//    Input, int A, B, the limits of the interval.
//
//    Input/output, int &SEED, the "seed" value, which should NOT be 0.
//    On output, SEED has been updated.
//
//    Output, int IVEC_UNIFORM_AB_NEW[N], a vector of random values 
//    between A and B.
//
{
  int c;
  int i;
  const int i4_huge = 2147483647;
  int k;
  float r;
  int value;
  int *x;
  
  if ( seed == 0 )
  {
    cerr << "\n";
    cerr << "I4VEC_UNIFORM_AB_NEW - Fatal error!\n";
    cerr << "  Input value of SEED = 0.\n";
    exit ( 1 );
  }
//
//  Guarantee A <= B.
//
  if ( b < a )
  {
    c = a;
    a = b;
    b = c;
  }

  x = new int[n];

  for ( i = 0; i < n; i++ )
  {
    k = seed / 127773;

    seed = 16807 * ( seed - k * 127773 ) - k * 2836;

    if ( seed < 0 )
    {
      seed = seed + i4_huge;
    }

    r = static_cast< float > (seed) * 4.656612875E-10;
//
//  Scale R to lie between A-0.5 and B+0.5.
//
    r = ( 1.0 - r ) * ( static_cast< float > ( a) - 0.5 ) 
      +         r   * ( static_cast< float > ( b) + 0.5 );
//
//  Use rounding to convert R to an integer between A and B.
//
    value = round ( r );
//
//  Guarantee A <= VALUE <= B.
//
    if ( value < a )
    {
      value = a;
    }
    if ( b < value )
    {
      value = b;
    }

    x[i] = value;
  }

  return x;
}